

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

char * __thiscall MeCab::anon_unknown_0::LatticeImpl::toString(LatticeImpl *this)

{
  StringBuffer *os;
  char *pcVar1;
  
  os = stream(this);
  pcVar1 = toStringInternal(this,os);
  return pcVar1;
}

Assistant:

const char *LatticeImpl::toString() {
  return toStringInternal(stream());
}